

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionNoBias8(void)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  bVar13 = false;
  uVar9 = 0;
  do {
    uVar10 = uVar9 & 0xff;
    bVar8 = false;
    lVar11 = -0x100000000000000;
    lVar7 = -0x101;
    do {
      if ((long)(uVar9 + lVar7) < 0) {
        iVar2 = 7;
      }
      else {
        uVar6 = uVar9 + lVar7 & 0xff;
        uVar3 = uVar6 | (uint)uVar9 & 0x300;
        if ((uint)uVar10 < (uint)uVar6) {
          uVar5 = uVar3 - 0x100;
          bVar12 = uVar6 - uVar10 < 0x80;
        }
        else {
          uVar5 = uVar3 + 0x100;
          bVar12 = uVar10 - uVar6 < 0x81;
        }
        if (bVar12) {
          uVar5 = uVar3;
        }
        iVar2 = 0;
        if ((lVar11 >> 0x38) + uVar9 != uVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = "
                     ,0x5c);
          poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", offset = ",0xb);
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          iVar2 = 1;
        }
      }
      if ((iVar2 != 7) && (iVar2 != 0)) {
        if (!bVar8) {
          return bVar13;
        }
        break;
      }
      lVar1 = lVar7 + 1;
      bVar8 = 0xff < lVar7;
      lVar11 = lVar11 + 0x100000000000000;
      lVar7 = lVar1;
    } while (lVar1 != 0x101);
    bVar13 = 0x1ff < uVar9;
    uVar9 = uVar9 + 1;
    if (uVar9 == 0x201) {
      return bVar13;
    }
  } while( true );
}

Assistant:

bool TestCompressionNoBias8()
{
    for (int64_t base = 0; base < 256 * 2 + 1; ++base)
    {
        for (int64_t offset = -256 - 1; offset < 256 + 1; ++offset)
        {
            const int64_t neighbor = base + offset;
            if (neighbor < 0) {
                continue;
            }

            Counter64 recent = base;
            Counter8 smaller = (uint8_t)neighbor;
            Counter64 reconstructed = Counter64::ExpandFromTruncated(recent, smaller);

            // Compare with reference version
            Counter64 ref_reconstructed = Counter64::ExpandFromTruncatedWithBias(recent, smaller, 0);

            if (reconstructed.ToUnsigned() != ref_reconstructed.ToUnsigned())
            {
                std::cout << "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = " << base << ", offset = " << offset << std::endl;

                COUNTER_DEBUG_BREAK();
                return false;
            }
        }
    }

    return true;
}